

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_button.cpp
# Opt level: O1

int create_sub_menu_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *pAVar2;
  Am_Object *prev;
  Am_Object new_window;
  Am_Object AStack_28;
  Am_Object local_20;
  Am_Object local_18;
  
  in_value = Am_Object::Get(self,0x1d2,7);
  Am_Object::Am_Object(&AStack_28,in_value);
  bVar1 = Am_Object::Valid(&AStack_28);
  if (!bVar1) {
    Am_Object::Create(&local_18,(char *)&Am_Option_Button_Sub_Window_Proto);
    pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(self);
    prev = Am_Object::Set(&local_18,0x1d3,pAVar2,0);
    Am_Object::operator=(&AStack_28,prev);
    Am_Object::~Am_Object(&local_18);
    Am_Object::Am_Object(&local_20,&AStack_28);
    Am_Object::Add_Part(&Am_Screen,&local_20,true,0);
    Am_Object::~Am_Object(&local_20);
    pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&AStack_28);
    Am_Object::Set(self,0x1d2,pAVar2,1);
    Am_Object::~Am_Object(&AStack_28);
    return -1;
  }
  Am_Error("create_sub_menu called but already has a menu");
}

Assistant:

int
create_sub_menu_proc(Am_Object &self)
{
  Am_Object new_window =
      self.Get(Am_SUB_MENU, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
  if (new_window.Valid())
    Am_Error("create_sub_menu called but already has a menu");
  new_window =
      Am_Option_Button_Sub_Window_Proto.Create().Set(Am_FOR_ITEM, self);
  Am_Screen.Add_Part(new_window);
  self.Set(Am_SUB_MENU, new_window, Am_OK_IF_NOT_THERE);
  return -1;
}